

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

basic_appender<char>
fmt::v11::detail::
do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<double>,fmt::v11::detail::digit_grouping<char>>
          (basic_appender<char> out,decimal_fp<double> *f,format_specs *specs,sign s,int exp_upper,
          locale_ref loc)

{
  bool bVar1;
  char cVar2;
  presentation_type pVar3;
  make_unsigned_t<int> mVar4;
  int iVar5;
  int in_ECX;
  basic_specs *in_RDX;
  undefined8 *in_RSI;
  buffer<char> *in_RDI;
  undefined4 in_R8D;
  undefined8 in_R9;
  bool pointy;
  int num_zeros;
  digit_grouping<char> grouping_1;
  int num_zeros_3;
  digit_grouping<char> grouping;
  int num_zeros_2;
  int exp;
  anon_class_40_8_fd1bf2f9 write;
  char exp_char;
  int exp_digits;
  int abs_output_exp;
  int num_zeros_1;
  anon_class_24_3_3ccdf9fd use_exp_format;
  int output_exp;
  char decimal_point;
  size_t size;
  char zero;
  int significand_size;
  significand_type significand;
  bool local_2a1;
  locale_ref in_stack_fffffffffffffd60;
  size_t in_stack_fffffffffffffd68;
  undefined1 *size_00;
  undefined4 in_stack_fffffffffffffd70;
  undefined4 in_stack_fffffffffffffd74;
  int a;
  basic_appender<char> in_stack_fffffffffffffd78;
  int in_stack_fffffffffffffd8c;
  undefined4 in_stack_fffffffffffffd90;
  undefined4 in_stack_fffffffffffffd94;
  undefined4 uVar6;
  anon_class_40_8_fd1bf2f9 *in_stack_fffffffffffffda0;
  undefined1 uVar7;
  iterator in_stack_fffffffffffffda8;
  locale_ref in_stack_fffffffffffffdb0;
  int local_224;
  undefined1 local_1d0 [68];
  int local_18c;
  int *local_188;
  undefined8 *local_180;
  int *local_178;
  undefined8 *local_170;
  undefined1 *local_168;
  basic_specs *local_160;
  char *local_158;
  int *local_150;
  undefined1 *local_148;
  buffer<char> *local_140;
  undefined8 local_128;
  undefined1 local_120 [64];
  int local_e0;
  int local_dc;
  buffer<char> *local_d8;
  buffer<char> *local_d0;
  buffer<char> *local_c8;
  basic_appender<char> local_c0;
  buffer<char> *local_b8;
  int local_b0;
  undefined8 local_a8;
  int local_a0;
  char local_9c;
  int local_98;
  undefined1 local_94;
  undefined1 local_93;
  int local_90;
  undefined1 local_81;
  undefined4 local_80;
  int local_7c;
  int local_78;
  basic_specs local_74;
  basic_specs local_6c;
  int local_64;
  undefined4 local_60;
  int local_5c;
  undefined8 local_58;
  char local_49;
  ulong local_48;
  undefined1 local_3d;
  int local_3c;
  undefined8 local_38;
  undefined4 local_30;
  int local_2c;
  basic_specs *local_28;
  undefined8 *local_20;
  undefined8 local_18;
  buffer<char> *local_10;
  buffer<char> *local_8;
  
  local_38 = *in_RSI;
  local_30 = in_R8D;
  local_2c = in_ECX;
  local_28 = in_RDX;
  local_20 = in_RSI;
  local_18 = in_R9;
  local_10 = in_RDI;
  local_3c = get_significand_size<double>((decimal_fp<double> *)0x134dd6);
  local_3d = 0x30;
  mVar4 = to_unsigned<int>(0);
  local_48 = (ulong)(mVar4 + (local_2c != 0));
  bVar1 = basic_specs::localized(local_28);
  if (bVar1) {
    local_58 = local_18;
    cVar2 = decimal_point<char>(in_stack_fffffffffffffd60);
    uVar6 = CONCAT13(cVar2,(int3)in_stack_fffffffffffffd94);
  }
  else {
    uVar6 = CONCAT13(0x2e,(int3)in_stack_fffffffffffffd94);
  }
  local_49 = (char)((uint)uVar6 >> 0x18);
  local_64 = *(int *)(local_20 + 1) + local_3c + -1;
  local_74 = *local_28;
  local_6c = local_28[1];
  local_60 = local_30;
  local_5c = local_64;
  bVar1 = do_write_float<char,_fmt::v11::basic_appender<char>,_fmt::v11::detail::dragonbox::decimal_fp<double>,_fmt::v11::detail::digit_grouping<char>_>
          ::anon_class_24_3_3ccdf9fd::operator()
                    ((anon_class_24_3_3ccdf9fd *)in_stack_fffffffffffffd78.container);
  if (bVar1) {
    local_78 = 0;
    bVar1 = basic_specs::alt(local_28);
    if (bVar1) {
      local_78 = *(int *)local_28[1].fill_data_ - local_3c;
      if (local_78 < 0) {
        local_78 = 0;
      }
      mVar4 = to_unsigned<int>(0);
      local_48 = mVar4 + local_48;
    }
    else if (local_3c == 1) {
      local_49 = '\0';
    }
    local_7c = local_5c;
    if (local_5c < 0) {
      local_7c = -local_5c;
    }
    local_80 = 2;
    if ((99 < local_7c) && (local_80 = 3, 999 < local_7c)) {
      local_80 = 4;
    }
    mVar4 = to_unsigned<int>(0);
    local_48 = mVar4 + local_48;
    bVar1 = basic_specs::upper(local_28);
    local_93 = 0x45;
    if (!bVar1) {
      local_93 = 0x65;
    }
    local_b0 = local_2c;
    local_a8 = local_38;
    local_a0 = local_3c;
    local_9c = local_49;
    local_98 = local_78;
    local_94 = 0x30;
    local_90 = local_5c;
    local_81 = local_93;
    if ((int)local_28[1].data_ < 1) {
      local_c0.container = local_10;
      local_d8 = local_10;
      local_d0 = (buffer<char> *)
                 reserve<char>(in_stack_fffffffffffffd78,
                               CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
      local_c8 = (buffer<char> *)
                 do_write_float<char,_fmt::v11::basic_appender<char>,_fmt::v11::detail::dragonbox::decimal_fp<double>,_fmt::v11::detail::digit_grouping<char>_>
                 ::anon_class_40_8_fd1bf2f9::operator()
                           (in_stack_fffffffffffffda0,in_stack_fffffffffffffda8);
      local_8 = (buffer<char> *)
                base_iterator<fmt::v11::basic_appender<char>>
                          (local_c0,(basic_appender<char>)local_c8);
    }
    else {
      local_b8 = local_10;
      local_8 = (buffer<char> *)
                write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<double>,fmt::v11::detail::digit_grouping<char>>(fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<double>const&,fmt::v11::format_specs_const&,fmt::v11::sign,int,fmt::v11::detail::locale_ref)::_lambda(fmt::v11::basic_appender<char>)_1_&>
                          (in_stack_fffffffffffffd78,
                           (format_specs *)
                           CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                           in_stack_fffffffffffffd68,
                           (anon_class_40_8_fd1bf2f9 *)in_stack_fffffffffffffd60.locale_);
    }
  }
  else {
    local_dc = *(int *)(local_20 + 1) + local_3c;
    if (*(int *)(local_20 + 1) < 0) {
      if (local_dc < 1) {
        local_224 = -local_dc;
        if (((local_3c == 0) && (-1 < *(int *)local_28[1].fill_data_)) &&
           (*(int *)local_28[1].fill_data_ < local_224)) {
          local_224 = *(int *)local_28[1].fill_data_;
        }
        local_2a1 = true;
        if ((local_224 == 0) && (local_2a1 = true, local_3c == 0)) {
          local_2a1 = basic_specs::alt(local_28);
        }
        mVar4 = to_unsigned<int>(0);
        local_48 = ((local_2a1 != false) + 1 + mVar4) + local_48;
        local_8 = (buffer<char> *)
                  write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<double>,fmt::v11::detail::digit_grouping<char>>(fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<double>const&,fmt::v11::format_specs_const&,fmt::v11::sign,int,fmt::v11::detail::locale_ref)::_lambda(fmt::v11::basic_appender<char>)_4_>
                            (in_stack_fffffffffffffd78,
                             (format_specs *)
                             CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                             in_stack_fffffffffffffd68,
                             (anon_class_56_7_88befd79 *)in_stack_fffffffffffffd60.locale_);
      }
      else {
        bVar1 = basic_specs::alt(local_28);
        uVar7 = (undefined1)((ulong)in_stack_fffffffffffffda0 >> 0x38);
        if (bVar1) {
          a = *(int *)local_28[1].fill_data_ - local_3c;
        }
        else {
          a = 0;
        }
        local_18c = a;
        iVar5 = max_of<int>(a,0);
        local_48 = local_48 + (iVar5 + 1);
        basic_specs::localized(local_28);
        size_00 = local_1d0;
        digit_grouping<char>::digit_grouping<fmt::v11::detail::locale_ref,_0>
                  ((digit_grouping<char> *)in_stack_fffffffffffffda8.container,
                   in_stack_fffffffffffffdb0,(bool)uVar7);
        iVar5 = digit_grouping<char>::count_separators
                          ((digit_grouping<char> *)CONCAT44(uVar6,in_stack_fffffffffffffd90),
                           in_stack_fffffffffffffd8c);
        mVar4 = to_unsigned<int>(0);
        local_48 = local_48 + mVar4;
        local_8 = (buffer<char> *)
                  write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<double>,fmt::v11::detail::digit_grouping<char>>(fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<double>const&,fmt::v11::format_specs_const&,fmt::v11::sign,int,fmt::v11::detail::locale_ref)::_lambda(fmt::v11::basic_appender<char>)_3_>
                            (in_stack_fffffffffffffd78,(format_specs *)CONCAT44(a,iVar5),
                             (size_t)size_00,
                             (anon_class_64_8_085c650e *)in_stack_fffffffffffffd60.locale_);
        digit_grouping<char>::~digit_grouping((digit_grouping<char> *)local_8);
      }
    }
    else {
      mVar4 = to_unsigned<int>(0);
      uVar7 = (undefined1)((ulong)in_stack_fffffffffffffda0 >> 0x38);
      local_48 = mVar4 + local_48;
      local_e0 = *(int *)local_28[1].fill_data_ - local_dc;
      abort_fuzzing_if(false);
      bVar1 = basic_specs::alt(local_28);
      if (bVar1) {
        local_48 = local_48 + 1;
        if ((local_e0 < 1) && (pVar3 = basic_specs::type(local_28), pVar3 != fixed)) {
          local_e0 = 0;
        }
        if (0 < local_e0) {
          mVar4 = to_unsigned<int>(0);
          local_48 = mVar4 + local_48;
        }
      }
      local_128 = local_18;
      basic_specs::localized(local_28);
      digit_grouping<char>::digit_grouping<fmt::v11::detail::locale_ref,_0>
                ((digit_grouping<char> *)in_stack_fffffffffffffda8.container,
                 in_stack_fffffffffffffdb0,(bool)uVar7);
      digit_grouping<char>::count_separators
                ((digit_grouping<char> *)CONCAT44(uVar6,in_stack_fffffffffffffd90),
                 in_stack_fffffffffffffd8c);
      mVar4 = to_unsigned<int>(0);
      local_48 = local_48 + mVar4;
      local_140 = local_10;
      local_188 = &local_2c;
      local_180 = &local_38;
      local_178 = &local_3c;
      local_170 = local_20;
      local_168 = local_120;
      local_160 = local_28;
      local_158 = &local_49;
      local_150 = &local_e0;
      local_148 = &local_3d;
      local_8 = (buffer<char> *)
                write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<double>,fmt::v11::detail::digit_grouping<char>>(fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<double>const&,fmt::v11::format_specs_const&,fmt::v11::sign,int,fmt::v11::detail::locale_ref)::_lambda(fmt::v11::basic_appender<char>)_2_>
                          (in_stack_fffffffffffffd78,
                           (format_specs *)
                           CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                           in_stack_fffffffffffffd68,
                           (anon_class_72_9_eb40e20e *)in_stack_fffffffffffffd60.locale_);
      digit_grouping<char>::~digit_grouping
                ((digit_grouping<char> *)in_stack_fffffffffffffd60.locale_);
    }
  }
  return (basic_appender<char>)local_8;
}

Assistant:

FMT_CONSTEXPR20 auto do_write_float(OutputIt out, const DecimalFP& f,
                                    const format_specs& specs, sign s,
                                    int exp_upper, locale_ref loc) -> OutputIt {
  auto significand = f.significand;
  int significand_size = get_significand_size(f);
  const Char zero = static_cast<Char>('0');
  size_t size = to_unsigned(significand_size) + (s != sign::none ? 1 : 0);
  using iterator = reserve_iterator<OutputIt>;

  Char decimal_point = specs.localized() ? detail::decimal_point<Char>(loc)
                                         : static_cast<Char>('.');

  int output_exp = f.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (specs.type() == presentation_type::exp) return true;
    if (specs.type() == presentation_type::fixed) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4;
    return output_exp < exp_lower ||
           output_exp >= (specs.precision > 0 ? specs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (specs.alt()) {
      num_zeros = specs.precision - significand_size;
      if (num_zeros < 0) num_zeros = 0;
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = specs.upper() ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (s != sign::none) *it++ = detail::getsign<Char>(s);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = detail::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0
               ? write_padded<Char, align::right>(out, specs, size, write)
               : base_iterator(out, write(reserve(out, size)));
  }

  int exp = f.exponent + significand_size;
  if (f.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(f.exponent);
    int num_zeros = specs.precision - exp;
    abort_fuzzing_if(num_zeros > 5000);
    if (specs.alt()) {
      ++size;
      if (num_zeros <= 0 && specs.type() != presentation_type::fixed)
        num_zeros = 0;
      if (num_zeros > 0) size += to_unsigned(num_zeros);
    }
    auto grouping = Grouping(loc, specs.localized());
    size += to_unsigned(grouping.count_separators(exp));
    return write_padded<Char, align::right>(out, specs, size, [&](iterator it) {
      if (s != sign::none) *it++ = detail::getsign<Char>(s);
      it = write_significand<Char>(it, significand, significand_size,
                                   f.exponent, grouping);
      if (!specs.alt()) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = specs.alt() ? specs.precision - significand_size : 0;
    size += 1 + static_cast<unsigned>(max_of(num_zeros, 0));
    auto grouping = Grouping(loc, specs.localized());
    size += to_unsigned(grouping.count_separators(exp));
    return write_padded<Char, align::right>(out, specs, size, [&](iterator it) {
      if (s != sign::none) *it++ = detail::getsign<Char>(s);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point, grouping);
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && specs.precision >= 0 &&
      specs.precision < num_zeros) {
    num_zeros = specs.precision;
  }
  bool pointy = num_zeros != 0 || significand_size != 0 || specs.alt();
  size += 1 + (pointy ? 1 : 0) + to_unsigned(num_zeros);
  return write_padded<Char, align::right>(out, specs, size, [&](iterator it) {
    if (s != sign::none) *it++ = detail::getsign<Char>(s);
    *it++ = zero;
    if (!pointy) return it;
    *it++ = decimal_point;
    it = detail::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}